

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

double __thiscall
libcellml::Generator::GeneratorImpl::scalingFactor(GeneratorImpl *this,VariablePtr *variable)

{
  double dVar1;
  undefined1 local_50 [48];
  UnitsPtr local_20;
  
  Variable::units((Variable *)&local_20);
  analyserVariable((GeneratorImpl *)local_50,(VariablePtr *)this);
  AnalyserVariable::variable((AnalyserVariable *)(local_50 + 0x10));
  Variable::units((Variable *)(local_50 + 0x20));
  dVar1 = Units::scalingFactor(&local_20,(UnitsPtr *)(local_50 + 0x20),true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x28));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return dVar1;
}

Assistant:

double Generator::GeneratorImpl::scalingFactor(const VariablePtr &variable) const
{
    // Return the scaling factor for the given variable.

    return Units::scalingFactor(variable->units(), analyserVariable(variable)->variable()->units());
}